

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kdasm.c
# Opt level: O3

void d68020_cpbcc_32(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  undefined8 in_RAX;
  char *pcVar4;
  uint in_EDI;
  uint uVar5;
  undefined4 uVar6;
  
  uVar1 = g_cpu_pc;
  uVar6 = (undefined4)((ulong)in_RAX >> 0x20);
  if (((byte)g_cpu_type & 0x1c) != 0) {
    uVar2 = dasm_read_imm_16(in_EDI);
    uVar3 = dasm_read_imm_32(in_EDI);
    uVar5 = g_cpu_ir >> 9;
    pcVar4 = g_cpcc[g_cpu_ir & 0x3f];
    get_imm_str_s(1);
    sprintf(g_dasm_str,"%db%-4s  %s; $%x (extension = $%x) (2-3)",(ulong)(uVar5 & 7),pcVar4,
            get_imm_str_s::str,(ulong)(uVar1 + uVar3),CONCAT44(uVar6,uVar2));
    return;
  }
  if ((~g_cpu_ir & 0xf000) == 0) {
    pcVar4 = "dc.w    $%04x; opcode 1111";
  }
  else {
    pcVar4 = "dc.w $%04x; ILLEGAL";
  }
  sprintf(g_dasm_str,pcVar4);
  return;
}

Assistant:

static void d68020_cpbcc_32(void)
{
	uint extension;
	uint new_pc = g_cpu_pc;
	LIMIT_CPU_TYPES(M68020_PLUS);
	extension = read_imm_16();
	new_pc += read_imm_32();
	sprintf(g_dasm_str, "%db%-4s  %s; $%x (extension = $%x) (2-3)", (g_cpu_ir>>9)&7, g_cpcc[g_cpu_ir&0x3f], get_imm_str_s16(), new_pc, extension);
}